

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiID *pIVar1;
  ImGuiID *pIVar2;
  float fVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiContext *g;
  float fVar9;
  float fVar10;
  ImVec2 pos;
  ImVec2 local_18;
  
  pIVar7 = GImGui;
  pIVar5 = GImGui->MovingWindow;
  if (pIVar5 == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    IVar4 = GImGui->ActiveId;
    if (GImGui->ActiveIdWindow->MoveId != IVar4) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar4;
    if (pIVar7->ActiveIdPreviousFrame == IVar4) {
      pIVar7->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar7->IO).MouseDown[0] != false) {
      return;
    }
    pIVar7->ActiveIdIsJustActivated = IVar4 != 0;
    if (IVar4 != 0) {
      pIVar7->ActiveIdTimer = 0.0;
      pIVar7->ActiveIdHasBeenPressed = false;
      pIVar7->ActiveIdHasBeenEdited = false;
    }
    pIVar7->ActiveId = 0;
    pIVar7->ActiveIdAllowNavDirFlags = 0;
    pIVar7->ActiveIdBlockNavInputFlags = 0;
    pIVar7->ActiveIdAllowOverlap = false;
    pIVar7->ActiveIdWindow = (ImGuiWindow *)0x0;
    return;
  }
  pIVar1 = &GImGui->ActiveId;
  pIVar2 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = *pIVar1;
  if (*pIVar2 == *pIVar1) {
    pIVar7->ActiveIdPreviousFrameIsAlive = true;
  }
  pIVar5 = pIVar5->RootWindow;
  if (pIVar5 == (ImGuiWindow *)0x0) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                  ,0xc5c,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  if (((pIVar7->IO).MouseDown[0] != true) ||
     (bVar8 = IsMousePosValid(&(pIVar7->IO).MousePos), !bVar8)) {
    pIVar6 = GImGui;
    bVar8 = GImGui->ActiveId != 0;
    GImGui->ActiveIdIsJustActivated = bVar8;
    if (bVar8) {
      pIVar6->ActiveIdTimer = 0.0;
      pIVar6->ActiveIdHasBeenPressed = false;
      pIVar6->ActiveIdHasBeenEdited = false;
    }
    pIVar6->ActiveId = 0;
    pIVar6->ActiveIdAllowNavDirFlags = 0;
    pIVar6->ActiveIdBlockNavInputFlags = 0;
    pIVar6->ActiveIdAllowOverlap = false;
    pIVar6->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar7->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  fVar9 = (pIVar7->IO).MousePos.x - (pIVar7->ActiveIdClickOffset).x;
  fVar10 = (pIVar7->IO).MousePos.y - (pIVar7->ActiveIdClickOffset).y;
  local_18.y = fVar10;
  local_18.x = fVar9;
  fVar3 = (pIVar5->Pos).x;
  if ((fVar3 == fVar9) && (!NAN(fVar3) && !NAN(fVar9))) {
    fVar3 = (pIVar5->Pos).y;
    if ((fVar3 == fVar10) && (!NAN(fVar3) && !NAN(fVar10))) goto LAB_0010f037;
  }
  if (((pIVar5->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  SetWindowPos(pIVar5,&local_18,1);
LAB_0010f037:
  FocusWindow(pIVar7->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}